

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

void __thiscall CPU::LDY_ZP_X(CPU *this)

{
  byte bVar1;
  int iVar2;
  
  this->cycles = 4;
  iVar2 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)this->pc);
  this->pc = this->pc + 1;
  this->cycles = this->cycles - 3;
  iVar2 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)(byte)((char)iVar2 + this->X));
  bVar1 = (byte)iVar2;
  this->Y = bVar1;
  (this->field_6).ps = bVar1 & 0x80 | (bVar1 == 0) * '\x02' | (this->field_6).ps & 0x7d;
  return;
}

Assistant:

void CPU::LDY_ZP_X()
{
    cycles = 4;
    uint8_t data = GetByte();
    data += X;
    cycles--;
    Y = ReadByte(data);
    Z = (Y == 0);
    N = (Y & 0b10000000) > 0;
}